

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O0

iterator __thiscall
eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::insert
          (vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *this,iterator pos,
          value_type *val)

{
  bool bVar1;
  iterator ppVar2;
  pair<eastl::pair<char,_int>_*,_bool> pVar3;
  iterator local_60;
  value_type *val_local;
  iterator pos_local;
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *this_local;
  
  ppVar2 = begin(this);
  if (((pos == ppVar2) ||
      (bVar1 = detail::compare_impl<eastl::pair<char,_int>,_eastl::less<char>_>::operator()
                         ((compare_impl<eastl::pair<char,_int>,_eastl::less<char>_> *)
                          &this->field_0x20,pos + -1,val), bVar1)) &&
     ((ppVar2 = end(this), pos == ppVar2 ||
      (bVar1 = detail::compare_impl<eastl::pair<char,_int>,_eastl::less<char>_>::operator()
                         ((compare_impl<eastl::pair<char,_int>,_eastl::less<char>_> *)
                          &this->field_0x20,val,pos), bVar1)))) {
    local_60 = vector<eastl::pair<char,_int>,_eastl::allocator>::insert(&this->m_base,pos,val);
  }
  else {
    pVar3 = insert(this,val);
    local_60 = pVar3.first;
  }
  return local_60;
}

Assistant:

iterator insert(iterator const pos, value_type const& val) {
    return
        ((pos == begin() || m_cmp(*(pos-1), val)) &&
         (pos ==   end() || m_cmp(val, *pos)))
        ? m_base.insert(pos, val)
        : insert(val).first
        ;
  }